

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O0

Klass<Foo2,_Foo> * __thiscall
squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>
          (Klass<Foo2,Foo> *this,string *name,offset_in_Foo2_to_subr f)

{
  string *name_00;
  HSQUIRRELVM vm;
  element_type *peVar1;
  offset_in_Foo2_to_subr in_RCX;
  function<void_(Foo2_*)> local_88;
  shared_ptr<squall::detail::KlassImp<Foo2>_> local_58;
  HSQOBJECT local_48;
  squall *local_38;
  offset_in_Foo2_to_subr f_local;
  string *local_28;
  string *name_local;
  Klass<Foo2,_Foo> *this_local;
  
  local_38 = (squall *)f;
  f_local = in_RCX;
  local_28 = name;
  name_local = (string *)this;
  this_local = (Klass<Foo2,_Foo> *)f;
  vm = VM::handle(*(VM **)this);
  std::weak_ptr<squall::detail::KlassImp<Foo2>_>::lock
            ((weak_ptr<squall::detail::KlassImp<Foo2>_> *)&local_58);
  peVar1 = std::
           __shared_ptr_access<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_58);
  local_48._type = (*(peVar1->super_KlassImpBase)._vptr_KlassImpBase[3])();
  name_00 = local_28;
  to_function<void(Foo2::*)()>(&local_88,local_38,f_local);
  detail::defun_local<void,Foo2*>(vm,&local_48,name_00,&local_88);
  std::function<void_(Foo2_*)>::~function(&local_88);
  std::shared_ptr<squall::detail::KlassImp<Foo2>_>::~shared_ptr(&local_58);
  return (Klass<Foo2,_Foo> *)this;
}

Assistant:

Klass<C, Base>& func(const string& name, F f) {
        detail::defun_local(
            vm_.handle(),
            imp_.lock()->get_klass_object(),
            name,
            to_function(f));
        return *this;
    }